

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_devices.cpp
# Opt level: O3

void __thiscall
cubeb_stream_get_current_device_Test::TestBody(cubeb_stream_get_current_device_Test *this)

{
  FILE *__stream;
  cubeb_stream *stream_00;
  cubeb *context;
  bool bVar1;
  char *pcVar2;
  AssertHelperData *pAVar3;
  stringstream *this_00;
  cubeb_device *this_01;
  anon_enum_32 *in_RCX;
  anon_enum_32 *actual;
  int r;
  AssertHelper local_a8;
  cubeb_device *device;
  AssertionResult gtest_ar_1;
  cubeb_stream *stream;
  cubeb *ctx;
  cubeb_stream_params local_78;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  ctx = (cubeb *)0x0;
  r = common_init(&ctx,"Cubeb audio test");
  local_78._0_8_ = (ulong)local_78.rate << 0x20;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&gtest_ar.success_,(char *)&r,(int *)&local_78,in_RCX);
  if (gtest_ar.success_ == false) {
    this_00 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_00);
    *(undefined8 *)(this_00 + *(long *)(*(long *)(this_00 + 0x10) + -0x18) + 0x18) = 0x11;
    local_78._0_8_ = this_00;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(this_00 + 0x10),"Error initializing cubeb library",0x20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_devices.cpp"
               ,0xd8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if ((((stringstream *)local_78._0_8_ != (stringstream *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((stringstream *)local_78._0_8_ != (stringstream *)0x0)) {
      (**(code **)(*(long *)local_78._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    context = ctx;
    __stream = _stdout;
    pcVar2 = cubeb_get_backend_id(ctx);
    fprintf(__stream,"Getting current devices for backend %s\n",pcVar2);
    stream = (cubeb_stream *)0x0;
    local_78.format = CUBEB_SAMPLE_FLOAT32LE;
    local_78.rate = 48000;
    local_78.channels = 1;
    local_78.layout = 4;
    gtest_ar.success_ = true;
    gtest_ar._1_7_ = 0xbb80000000;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000001;
    local_78.prefs = CUBEB_STREAM_PREF_NONE;
    actual = (anon_enum_32 *)0x0;
    r = cubeb_stream_init(ctx,&stream,"Cubeb duplex",(cubeb_devid)0x0,
                          (cubeb_stream_params *)&gtest_ar,(cubeb_devid)0x0,&local_78,0x400,
                          data_cb_duplex,state_cb_duplex,(void *)0x0);
    device = (cubeb_device *)((ulong)device._4_4_ << 0x20);
    testing::internal::EqHelper<false>::Compare<int,__0>
              (&gtest_ar_1.success_,(char *)&r,(int *)&device,actual);
    if (gtest_ar_1.success_ == false) {
      this_01 = (cubeb_device *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream((stringstream *)this_01);
      *(undefined8 *)((long)&this_01[1].input_name + *(long *)(this_01[1].output_name + -0x18)) =
           0x11;
      device = this_01;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(this_01 + 1),"Error initializing cubeb stream",0x1f);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_devices.cpp"
                 ,0xed,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&device);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      if (((device != (cubeb_device *)0x0) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         (device != (cubeb_device *)0x0)) {
        (**(code **)(device->output_name + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_1.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_1.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      stream_00 = stream;
      r = cubeb_stream_get_current_device(stream,&device);
      if (r == -4) {
        TestBody();
      }
      else {
        local_a8.data_ = local_a8.data_ & 0xffffffff00000000;
        testing::internal::EqHelper<false>::Compare<int,__0>
                  (&gtest_ar_1.success_,(char *)&r,(int *)&local_a8,actual);
        if (gtest_ar_1.success_ == false) {
          pAVar3 = (AssertHelperData *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream((stringstream *)pAVar3);
          *(undefined8 *)
           ((long)&(pAVar3->message).c_str_ + *(long *)(*(long *)&pAVar3->line + -0x18)) = 0x11;
          local_a8.data_ = pAVar3;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pAVar3->line,"Error getting current devices",0x1d);
          if (gtest_ar_1.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_devices.cpp"
                     ,0xf8,pcVar2);
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if (((local_a8.data_ != (AssertHelperData *)0x0) &&
              (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
             (local_a8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_a8.data_ + 8))();
          }
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar_1.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          fprintf(_stdout,"Current output device: %s\n",device->output_name);
          fprintf(_stdout,"Current input device: %s\n",device->input_name);
          r = cubeb_stream_device_destroy(stream,device);
          local_a8.data_ = local_a8.data_ & 0xffffffff00000000;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (&gtest_ar_1.success_,(char *)&r,(int *)&local_a8,actual);
          if (gtest_ar_1.success_ == false) {
            pAVar3 = (AssertHelperData *)operator_new(0x188);
            std::__cxx11::stringstream::stringstream((stringstream *)pAVar3);
            *(undefined8 *)
             ((long)&(pAVar3->message).c_str_ + *(long *)(*(long *)&pAVar3->line + -0x18)) = 0x11;
            local_a8.data_ = pAVar3;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&pAVar3->line,"Error destroying current devices",0x20);
            if (gtest_ar_1.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_devices.cpp"
                       ,0xfe,pcVar2);
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a8);
            testing::internal::AssertHelper::~AssertHelper(&local_38);
            if (((local_a8.data_ != (AssertHelperData *)0x0) &&
                (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
               (local_a8.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_a8.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_1.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      if (stream_00 != (cubeb_stream *)0x0) {
        cubeb_stream_destroy(stream_00);
      }
    }
    if (context != (cubeb *)0x0) {
      cubeb_destroy(context);
    }
  }
  return;
}

Assistant:

TEST(cubeb, stream_get_current_device)
{
  cubeb * ctx = NULL;
  int r = common_init(&ctx, "Cubeb audio test");
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb library";

  std::unique_ptr<cubeb, decltype(&cubeb_destroy)>
    cleanup_cubeb_at_exit(ctx, cubeb_destroy);

  fprintf(stdout, "Getting current devices for backend %s\n",
    cubeb_get_backend_id(ctx));

  cubeb_stream * stream = NULL;
  cubeb_stream_params input_params;
  cubeb_stream_params output_params;

  input_params.format = output_params.format = CUBEB_SAMPLE_FLOAT32NE;
  input_params.rate = output_params.rate = 48000;
  input_params.channels = output_params.channels = 1;
  input_params.layout = output_params.layout = CUBEB_LAYOUT_MONO;
  input_params.prefs = output_params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "Cubeb duplex",
                        NULL, &input_params, NULL, &output_params,
                        1024, data_cb_duplex, state_cb_duplex, nullptr);
  ASSERT_EQ(r, CUBEB_OK) << "Error initializing cubeb stream";
  std::unique_ptr<cubeb_stream, decltype(&cubeb_stream_destroy)>
    cleanup_stream_at_exit(stream, cubeb_stream_destroy);

  cubeb_device * device;
  r = cubeb_stream_get_current_device(stream, &device);
  if (r == CUBEB_ERROR_NOT_SUPPORTED) {
    fprintf(stderr, "Getting current device is not supported"
                    " for this backend, skipping this test.\n");
    return;
  }
  ASSERT_EQ(r, CUBEB_OK) << "Error getting current devices";

  fprintf(stdout, "Current output device: %s\n", device->output_name);
  fprintf(stdout, "Current input device: %s\n", device->input_name);

  r = cubeb_stream_device_destroy(stream, device);
  ASSERT_EQ(r, CUBEB_OK) << "Error destroying current devices";
}